

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O1

ON_ProgressStepCounter *
ON_ProgressStepCounter::Create
          (ON_ProgressStepCounter *__return_storage_ptr__,ON_ProgressReporter *progress_reporter,
          uint step_count,double progress_interval_start,double progress_interval_finish,
          uint maximum_progress_reports)

{
  if ((((progress_reporter == (ON_ProgressReporter *)0x0) || (step_count == 0)) ||
      (progress_interval_start < 0.0)) ||
     (maximum_progress_reports == 0 ||
      (progress_interval_finish <= progress_interval_start || 1.0 < progress_interval_finish))) {
    __return_storage_ptr__->m_progress_interval_finish = 0.0;
    __return_storage_ptr__->m_step_interval = 0;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = 0;
    __return_storage_ptr__->m_progress_interval_start = 0.0;
    __return_storage_ptr__->m_progress_reporter = (ON_ProgressReporter *)0x0;
    __return_storage_ptr__->m_step_index = 0;
    __return_storage_ptr__->m_step_count = 0;
  }
  else {
    __return_storage_ptr__->m_progress_interval_start = 0.0;
    __return_storage_ptr__->m_progress_interval_finish = 0.0;
    __return_storage_ptr__->m_progress_reporter = (ON_ProgressReporter *)0x0;
    __return_storage_ptr__->m_step_index = 0;
    __return_storage_ptr__->m_step_count = 0;
    __return_storage_ptr__->m_step_interval = 0;
    __return_storage_ptr__->m_step_count = step_count;
    if (maximum_progress_reports < step_count) {
      step_count = step_count / maximum_progress_reports;
    }
    __return_storage_ptr__->m_step_interval = step_count + (step_count == 0);
    __return_storage_ptr__->m_progress_interval_start = progress_interval_start;
    __return_storage_ptr__->m_progress_interval_finish = progress_interval_finish;
    __return_storage_ptr__->m_progress_reporter = progress_reporter;
    ON_ProgressReporter::ReportProgress(progress_reporter,progress_interval_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_ProgressStepCounter ON_ProgressStepCounter::Create(
  ON_ProgressReporter* progress_reporter,
  unsigned int step_count,
  double progress_interval_start,
  double progress_interval_finish,
  unsigned int maximum_progress_reports
  )
{
  if (nullptr != progress_reporter
    && step_count > 0
    && 0.0 <= progress_interval_start
    && progress_interval_start < progress_interval_finish
    && progress_interval_finish <= 1.0
    && maximum_progress_reports > 0
    )
  {
    ON_ProgressStepCounter counter;
    counter.m_step_index = 0;
    counter.m_step_count = step_count;
    counter.m_step_interval = (step_count <= maximum_progress_reports) ? step_count : (step_count/maximum_progress_reports);
    if ( counter.m_step_interval <= 0 )
      counter.m_step_interval = 1;
    counter.m_progress_interval_start = progress_interval_start;
    counter.m_progress_interval_finish = progress_interval_finish;
    counter.m_progress_reporter = progress_reporter;
    ON_ProgressReporter::ReportProgress(progress_reporter,counter.Progress());
    return counter;
  }

  return ON_ProgressStepCounter::Empty;
}